

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

ssize_t __thiscall Log::write(Log *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  element_type *peVar6;
  size_t sVar7;
  char *pcVar8;
  undefined4 in_register_00000034;
  __shared_ptr *this_00;
  String *local_58;
  int outLength;
  String *str;
  int len_local;
  char *data_local;
  Log *this_local;
  
  this_00 = (__shared_ptr *)CONCAT44(in_register_00000034,__fd);
  str._4_4_ = (int)__n;
  if ((__buf != (void *)0x0) && (bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00), bVar1))
  {
    if (str._4_4_ == -1) {
      sVar5 = strlen((char *)__buf);
      str._4_4_ = (int)sVar5;
    }
    if (str._4_4_ < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Log.h",
                    0xb4,"Log Log::write(const char *, int)");
    }
    if (str._4_4_ != 0) {
      peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      if (peVar6->outPtr == (String *)0x0) {
        peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        local_58 = &peVar6->out;
      }
      else {
        peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        local_58 = peVar6->outPtr;
      }
      sVar7 = String::size(local_58);
      iVar3 = (int)sVar7;
      peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      if (peVar6->disableSpacingOverride == 0) {
        peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        if (((peVar6->spacing & 1U) != 0) && (iVar3 != 0)) {
          sVar7 = String::size(local_58);
          cVar2 = String::at(local_58,sVar7 - 1);
          iVar4 = isspace((int)cVar2);
          if ((iVar4 == 0) && (iVar4 = isspace((int)*__buf), iVar4 == 0)) {
            String::resize(local_58,(long)(iVar3 + str._4_4_ + 1));
            pcVar8 = String::operator[](local_58,(long)iVar3);
            *pcVar8 = ' ';
            pcVar8 = String::data(local_58);
            memcpy(pcVar8 + (long)iVar3 + 1,__buf,(long)str._4_4_);
            goto LAB_002289f7;
          }
        }
        String::resize(local_58,(long)(iVar3 + str._4_4_));
        pcVar8 = String::data(local_58);
        memcpy(pcVar8 + iVar3,__buf,(long)str._4_4_);
      }
      else {
        peVar6 = std::__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Log::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        peVar6->disableSpacingOverride = peVar6->disableSpacingOverride + -1;
        String::resize(local_58,(long)(iVar3 + str._4_4_));
        pcVar8 = String::data(local_58);
        memcpy(pcVar8 + iVar3,__buf,(long)str._4_4_);
      }
    }
  }
LAB_002289f7:
  Log(this,(Log *)this_00);
  return (ssize_t)this;
}

Assistant:

Log write(const char *data, int len = -1)
    {
        if (data && mData) {
            if (len == -1)
                len = strlen(data);
            assert(len >= 0);
            if (len) {
                String &str = mData->outPtr ? *mData->outPtr : mData->out;
                const int outLength = str.size();
                if (mData->disableSpacingOverride) {
                    --mData->disableSpacingOverride;
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                } else if (mData->spacing && outLength && !isspace(str.at(str.size() - 1)) && !isspace(*data)) {
                    str.resize(outLength + len + 1);
                    str[outLength] = ' ';
                    memcpy(str.data() + outLength + 1, data, len);
                } else {
                    str.resize(outLength + len);
                    memcpy(str.data() + outLength, data, len);
                }
            }
        }
        return *this;
    }